

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_show_colormap.cxx
# Opt level: O0

void __thiscall ColorMenu::drawbox(ColorMenu *this,Fl_Color c)

{
  int iVar1;
  int iVar2;
  int Y;
  int X;
  Fl_Color c_local;
  ColorMenu *this_local;
  
  if (c < 0x100) {
    iVar1 = (c & 7) * 0xe;
    iVar2 = (c >> 3) * 0xe;
    if (c == this->which) {
      fl_draw_box(FL_DOWN_BOX,iVar1 + 5,iVar2 + 5,0xd,0xd,c);
    }
    else {
      fl_draw_box(FL_BORDER_BOX,iVar1 + 4,iVar2 + 4,0xf,0xf,c);
    }
  }
  return;
}

Assistant:

void ColorMenu::drawbox(Fl_Color c) {
  if (c > 255) return;
  int X = (c%8)*BOXSIZE+BORDER;
  int Y = (c/8)*BOXSIZE+BORDER;
#if BORDER_WIDTH < 3
  if (c == which) fl_draw_box(FL_DOWN_BOX, X+1, Y+1, BOXSIZE-1, BOXSIZE-1, c);
  else fl_draw_box(FL_BORDER_BOX, X, Y, BOXSIZE+1, BOXSIZE+1, c);
#else
  fl_draw_box(c == which ? FL_DOWN_BOX : FL_BORDER_BOX,
	      X, Y, BOXSIZE+1, BOXSIZE+1, c);
#endif
}